

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic128.h
# Opt level: O2

Int128 * atomic16_cmpxchg(Int128 *__return_storage_ptr__,Int128 *ptr,Int128 cmp,Int128 new)

{
  undefined1 auVar1 [16];
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  
  LOCK();
  auVar1._8_8_ = in_RDX;
  auVar1._0_8_ = ptr;
  if (auVar1 == (undefined1  [16])*__return_storage_ptr__) {
    *(undefined8 *)__return_storage_ptr__ = in_RCX;
    *(undefined8 *)((long)__return_storage_ptr__ + 8) = in_R8;
  }
  else {
    ptr = (Int128 *)*__return_storage_ptr__;
  }
  UNLOCK();
  return ptr;
}

Assistant:

static inline Int128 atomic16_cmpxchg(Int128 *ptr, Int128 cmp, Int128 new)
{
#ifdef _MSC_VER
    /* compare and swap. the same as __sync_val_compare_and_swap().
        if the current value of *ptr is cmp, then write new into *ptr,
        return *ptr old value. */
    Int128 save = *ptr;
    if (!memcmp(ptr, &cmp, sizeof(cmp))) {
        *ptr = new;
    }
    return save;
#else
    return __sync_val_compare_and_swap_16(ptr, cmp, new);
#endif
}